

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O2

void print<std::stack<char,std::vector<char,std::allocator<char>>>>
               (stack<char,_std::vector<char,_std::allocator<char>_>_> *t,char *s)

{
  ostream *poVar1;
  pointer pcVar2;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  pcVar2 = (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  while ((t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start != pcVar2) {
    poVar1 = std::operator<<((ostream *)&std::cout,' ');
    std::operator<<(poVar1,(t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish[-1]);
    pcVar2 = (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish + -1;
    (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = pcVar2;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}